

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O1

int __thiscall TPZString::Replace(TPZString *this,char *replace_str,char *new_substr)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  string newstring;
  allocator<char> local_59;
  TPZString *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,
             (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore
             ,&local_59);
  sVar1 = strlen(replace_str);
  strlen(replace_str);
  iVar3 = 0;
  uVar2 = std::__cxx11::string::find((char *)local_50,(ulong)replace_str,0);
  if (uVar2 != 0xffffffffffffffff) {
    iVar3 = 0;
    do {
      strlen(new_substr);
      std::__cxx11::string::replace
                ((ulong)local_50,uVar2,(char *)(long)(int)sVar1,(ulong)new_substr);
      strlen(replace_str);
      uVar2 = std::__cxx11::string::find((char *)local_50,(ulong)replace_str,0);
      iVar3 = iVar3 + 1;
    } while (uVar2 != 0xffffffffffffffff);
  }
  if (iVar3 != 0) {
    strncpy((local_58->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
            fStore,(char *)local_50[0],
            (local_58->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
            fNElements);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return iVar3;
}

Assistant:

int TPZString::Replace( const char * replace_str, const char *new_substr){
	string newstring(fStore);
	const int replace_len = strlen(replace_str);
	int  count = 0;
	string::size_type pos = newstring.find(replace_str, 0);
	while( pos!= string::npos) {
		newstring.replace(pos, replace_len, new_substr);
		pos = newstring.find(replace_str, 0);
		count++;
	}
	if(count) strncpy(fStore, newstring.c_str(), fNElements);
	return(count);
}